

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verStream.c
# Opt level: O0

void Ver_StreamReload(Ver_Stream_t *p)

{
  int iVar1;
  char *local_30;
  int local_28;
  int RetValue;
  int nCharsToRead;
  int nCharsUsed;
  Ver_Stream_t *p_local;
  
  if (p->fStop != 0) {
    __assert_fail("!p->fStop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                  ,0x80,"void Ver_StreamReload(Ver_Stream_t *)");
  }
  if (p->pBufferStop < p->pBufferCur) {
    if (p->pBufferCur < p->pBufferEnd) {
      iVar1 = (int)p->pBufferEnd - (int)p->pBufferCur;
      memmove(p->pBuffer,p->pBufferCur,(long)iVar1);
      p->pBufferCur = p->pBuffer;
      if (p->nBufferSize - (long)iVar1 < p->nFileSize - p->nFileRead) {
        local_28 = (int)p->nBufferSize - iVar1;
      }
      else {
        local_28 = (int)p->nFileSize - (int)p->nFileRead;
      }
      fread(p->pBuffer + iVar1,(long)local_28,1,(FILE *)p->pFile);
      p->nFileRead = (long)local_28 + p->nFileRead;
      p->pBufferEnd = p->pBuffer + (long)local_28 + (long)iVar1;
      if (p->nFileRead == p->nFileSize) {
        local_30 = p->pBufferEnd;
      }
      else {
        local_30 = p->pBuffer + 0xf0000;
      }
      p->pBufferStop = local_30;
      return;
    }
    __assert_fail("p->pBufferCur < p->pBufferEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                  ,0x82,"void Ver_StreamReload(Ver_Stream_t *)");
  }
  __assert_fail("p->pBufferCur > p->pBufferStop",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                ,0x81,"void Ver_StreamReload(Ver_Stream_t *)");
}

Assistant:

void Ver_StreamReload( Ver_Stream_t * p )
{
    int nCharsUsed, nCharsToRead;
    int RetValue;
    assert( !p->fStop );
    assert( p->pBufferCur > p->pBufferStop );
    assert( p->pBufferCur < p->pBufferEnd );
    // figure out how many chars are still not processed
    nCharsUsed = p->pBufferEnd - p->pBufferCur;
    // move the remaining data to the beginning of the buffer
    memmove( p->pBuffer, p->pBufferCur, (size_t)nCharsUsed );
    p->pBufferCur = p->pBuffer;
    // determine how many chars we will read
    nCharsToRead = VER_MINIMUM( p->nBufferSize - nCharsUsed, p->nFileSize - p->nFileRead );
    // read the chars
    RetValue = fread( p->pBuffer + nCharsUsed, nCharsToRead, 1, p->pFile );
    p->nFileRead += nCharsToRead;
    // set the ponters to the end and the stopping point
    p->pBufferEnd  = p->pBuffer + nCharsUsed + nCharsToRead;
    p->pBufferStop = (p->nFileRead == p->nFileSize)? p->pBufferEnd : p->pBuffer + VER_BUFFER_SIZE - VER_OFFSET_SIZE;
}